

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void EOPLL_RateConv_delete(EOPLL_RateConv *conv)

{
  int local_14;
  int i;
  EOPLL_RateConv *conv_local;
  
  for (local_14 = 0; local_14 < conv->ch; local_14 = local_14 + 1) {
    free(conv->buf[local_14]);
  }
  free(conv->buf);
  free(conv->sinc_table);
  free(conv);
  return;
}

Assistant:

void EOPLL_RateConv_delete(EOPLL_RateConv *conv) {
  int i;
  for (i = 0; i < conv->ch; i++) {
    free(conv->buf[i]);
  }
  free(conv->buf);
  free(conv->sinc_table);
  free(conv);
}